

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

char * Diligent::GetFramebufferStatusString(GLenum Status)

{
  char *pcStack_10;
  GLenum Status_local;
  
  if (Status == 0x8cd5) {
    pcStack_10 = "GL_FRAMEBUFFER_COMPLETE";
  }
  else if (Status == 0x8cd6) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT";
  }
  else if (Status == 0x8cd7) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT";
  }
  else if (Status == 0x8cdb) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER";
  }
  else if (Status == 0x8cdc) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER";
  }
  else if (Status == 0x8cdd) {
    pcStack_10 = "GL_FRAMEBUFFER_UNSUPPORTED";
  }
  else if (Status == 0x8d56) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE";
  }
  else if (Status == 0x8da8) {
    pcStack_10 = "GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS";
  }
  else {
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetFramebufferStatusString(GLenum Status)
{
    switch (Status)
    {
        // clang-format off
        case GL_FRAMEBUFFER_COMPLETE:                      return "GL_FRAMEBUFFER_COMPLETE";
        case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:         return "GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT";
        case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT: return "GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT";
        case GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER:        return "GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER";
        case GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER:        return "GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER";
        case GL_FRAMEBUFFER_UNSUPPORTED:                   return "GL_FRAMEBUFFER_UNSUPPORTED";
        case GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE:        return "GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE";
        case GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS:      return "GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS";
        // clang-format on
        default:
            return "UNKNOWN";
    }
}